

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O3

void __thiscall
FIX::ExeceptionStore::get
          (ExeceptionStore *this,int param_1,int param_2,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_3)

{
  IOException *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  string local_40;
  
  this_00 = (IOException *)
            __cxa_allocate_exception
                      (0x50,CONCAT44(in_register_00000034,param_1),
                       CONCAT44(in_register_00000014,param_2));
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"get threw an IOException","")
  ;
  IOException::IOException(this_00,&local_40);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void get( int, int, std::vector < std::string > & ) const EXCEPT ( IOException ) {
    throw IOException("get threw an IOException");
  }